

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O1

LY_ERR lyb_print_node_leaf(ly_out *out,lyd_node *node,lyd_lyb_ctx *lybctx)

{
  int iVar1;
  lylyb_ctx *lybctx_00;
  lysc_node *plVar2;
  code *pcVar3;
  ly_ctx *plVar4;
  LY_ERR LVar5;
  uint8_t *buf;
  size_t sVar6;
  ly_bool dynamic;
  char local_39;
  ulong local_38;
  ulong local_30;
  
  LVar5 = lyb_print_node_header(out,node,lybctx);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  lybctx_00 = lybctx->lybctx;
  local_39 = '\0';
  local_38 = 0;
  if ((((node[1].schema == (lysc_node *)0x0) ||
       (plVar2 = (node[1].schema)->parent, plVar2 == (lysc_node *)0x0)) ||
      (pcVar3 = (code *)plVar2->name, pcVar3 == (code *)0x0)) || (node->schema == (lysc_node *)0x0))
  {
    __assert_fail("term->value.realtype && term->value.realtype->plugin && term->value.realtype->plugin->print && term->schema"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
                  ,0x2b8,
                  "LY_ERR lyb_print_term_value(struct lyd_node_term *, struct ly_out *, struct lylyb_ctx *)"
                 );
  }
  iVar1 = *(int *)&plVar2->exts;
  sVar6 = (size_t)iVar1;
  plVar4 = node->schema->module->ctx;
  if ((long)sVar6 < 0) {
    buf = (uint8_t *)(*pcVar3)(plVar4,node + 1,5,0,&local_39,&local_38);
    if (local_38 >> 0x20 != 0) {
      LVar5 = LY_EINT;
      ly_log(lybctx_00->ctx,LY_LLERR,LY_EINT,
             "The maximum length of the LYB data from a term node must not exceed %u.",0xffffffff);
      goto LAB_00140929;
    }
    local_30 = local_38;
    LVar5 = lyb_write(out,(uint8_t *)&local_30,8,lybctx_00);
    if ((LVar5 != LY_SUCCESS) || (local_38 == 0)) goto LAB_00140929;
  }
  else {
    LVar5 = LY_SUCCESS;
    buf = (uint8_t *)(*pcVar3)(plVar4,node + 1,5,0,&local_39,0);
    local_38 = sVar6;
    if (iVar1 == 0) goto LAB_00140929;
  }
  LVar5 = lyb_write(out,buf,local_38,lybctx_00);
LAB_00140929:
  if (local_39 != '\0') {
    free(buf);
  }
  return LVar5;
}

Assistant:

static LY_ERR
lyb_print_node_leaf(struct ly_out *out, const struct lyd_node *node, struct lyd_lyb_ctx *lybctx)
{
    /* write necessary basic data */
    LY_CHECK_RET(lyb_print_node_header(out, node, lybctx));

    /* write term value */
    LY_CHECK_RET(lyb_print_term_value((struct lyd_node_term *)node, out, lybctx->lybctx));

    return LY_SUCCESS;
}